

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type.pb.cc
# Opt level: O3

char * __thiscall google::protobuf::Type::_InternalParse(Type *this,char *ptr,ParseContext *ctx)

{
  InternalMetadata *this_00;
  ArenaStringPtr *this_01;
  byte bVar1;
  int iVar2;
  Rep *pRVar3;
  internal *piVar4;
  char *pcVar5;
  bool bVar6;
  SourceContext *msg;
  string *psVar7;
  Option *msg_00;
  Field *msg_01;
  ArenaStringPtr *field_name;
  Rep *pRVar8;
  ulong uVar9;
  int iVar10;
  Arena *pAVar11;
  UnknownFieldSet *unknown;
  byte *p;
  char cVar12;
  uint uVar13;
  pair<const_char_*,_unsigned_int> pVar14;
  pair<const_char_*,_unsigned_long> pVar15;
  StringPiece str;
  StringPiece str_00;
  byte *local_38;
  
  this_00 = &(this->super_Message).super_MessageLite._internal_metadata_;
  this_01 = &this->name_;
  local_38 = (byte *)ptr;
  do {
    bVar6 = internal::EpsCopyInputStream::DoneWithCheck
                      (&ctx->super_EpsCopyInputStream,(char **)&local_38,ctx->group_depth_);
    if (bVar6) {
      return (char *)local_38;
    }
    bVar1 = *local_38;
    uVar13 = (uint)bVar1;
    p = local_38 + 1;
    if ((char)bVar1 < '\0') {
      uVar13 = ((uint)bVar1 + (uint)*p * 0x80) - 0x80;
      if ((char)*p < '\0') {
        pVar14 = internal::ReadTagFallback((char *)local_38,uVar13);
        p = (byte *)pVar14.first;
        if (p == (byte *)0x0) {
          return (char *)0x0;
        }
        uVar13 = pVar14.second;
      }
      else {
        p = local_38 + 2;
      }
    }
    cVar12 = (char)uVar13;
    local_38 = p;
    switch(uVar13 >> 3) {
    case 1:
      if (cVar12 != '\n') break;
      pAVar11 = (Arena *)this_00->ptr_;
      if (((ulong)pAVar11 & 1) != 0) {
        pAVar11 = *(Arena **)((ulong)pAVar11 & 0xfffffffffffffffe);
      }
      psVar7 = this_01->ptr_;
      field_name = this_01;
      if (psVar7 == (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
        internal::ArenaStringPtr::CreateInstance
                  (this_01,pAVar11,(string *)&internal::fixed_address_empty_string_abi_cxx11_);
        psVar7 = this_01->ptr_;
      }
      local_38 = (byte *)internal::InlineGreedyStringParser(psVar7,(char *)local_38,ctx);
      piVar4 = (internal *)(psVar7->_M_dataplus)._M_p;
      pcVar5 = (char *)psVar7->_M_string_length;
      if ((long)pcVar5 < 0) {
        StringPiece::LogFatalSizeTooBig((size_t)pcVar5,"size_t to int conversion");
      }
      str.length_ = (stringpiece_ssize_type)"google.protobuf.Type.name";
      str.ptr_ = pcVar5;
      bVar6 = internal::VerifyUTF8(piVar4,str,(char *)field_name);
      if (!bVar6) {
        return (char *)0x0;
      }
      cVar12 = (local_38 == (byte *)0x0) * '\x02' + '\x02';
      goto LAB_0020cc8a;
    case 2:
      if (cVar12 == '\x12') {
        local_38 = p + -1;
        do {
          local_38 = local_38 + 1;
          pRVar8 = (this->fields_).super_RepeatedPtrFieldBase.rep_;
          if (pRVar8 == (Rep *)0x0) {
            iVar10 = (this->fields_).super_RepeatedPtrFieldBase.total_size_;
LAB_0020cb81:
            internal::RepeatedPtrFieldBase::Reserve
                      (&(this->fields_).super_RepeatedPtrFieldBase,iVar10 + 1);
            pRVar8 = (this->fields_).super_RepeatedPtrFieldBase.rep_;
            iVar10 = pRVar8->allocated_size;
LAB_0020cb92:
            pRVar8->allocated_size = iVar10 + 1;
            msg_01 = Arena::CreateMaybeMessage<google::protobuf::Field>
                               ((this->fields_).super_RepeatedPtrFieldBase.arena_);
            pRVar8 = (this->fields_).super_RepeatedPtrFieldBase.rep_;
            iVar10 = (this->fields_).super_RepeatedPtrFieldBase.current_size_;
            (this->fields_).super_RepeatedPtrFieldBase.current_size_ = iVar10 + 1;
            pRVar8->elements[iVar10] = msg_01;
          }
          else {
            iVar2 = (this->fields_).super_RepeatedPtrFieldBase.current_size_;
            iVar10 = pRVar8->allocated_size;
            if (iVar10 <= iVar2) {
              if (iVar10 == (this->fields_).super_RepeatedPtrFieldBase.total_size_)
              goto LAB_0020cb81;
              goto LAB_0020cb92;
            }
            (this->fields_).super_RepeatedPtrFieldBase.current_size_ = iVar2 + 1;
            msg_01 = (Field *)pRVar8->elements[iVar2];
          }
          local_38 = (byte *)internal::ParseContext::ParseMessage<google::protobuf::Field>
                                       (ctx,msg_01,(char *)local_38);
          if (local_38 == (byte *)0x0) {
            return (char *)0x0;
          }
        } while ((local_38 < (ctx->super_EpsCopyInputStream).limit_end_) && (*local_38 == 0x12));
LAB_0020cc3e:
        cVar12 = '\x02';
        goto LAB_0020cc8a;
      }
      break;
    case 3:
      if (cVar12 == '\x1a') {
        local_38 = p + -1;
        do {
          local_38 = local_38 + 1;
          pRVar8 = (this->oneofs_).super_RepeatedPtrFieldBase.rep_;
          if (pRVar8 == (Rep *)0x0) {
            iVar10 = (this->oneofs_).super_RepeatedPtrFieldBase.total_size_;
LAB_0020c9bb:
            internal::RepeatedPtrFieldBase::Reserve
                      (&(this->oneofs_).super_RepeatedPtrFieldBase,iVar10 + 1);
            pRVar8 = (this->oneofs_).super_RepeatedPtrFieldBase.rep_;
            iVar10 = pRVar8->allocated_size;
LAB_0020c9cb:
            pRVar8->allocated_size = iVar10 + 1;
            pAVar11 = (this->oneofs_).super_RepeatedPtrFieldBase.arena_;
            if (pAVar11 == (Arena *)0x0) {
              psVar7 = (string *)operator_new(0x20);
            }
            else {
              if (pAVar11->hooks_cookie_ != (void *)0x0) {
                Arena::OnArenaAllocation(pAVar11,(type_info *)&std::__cxx11::string::typeinfo,0x20);
              }
              psVar7 = (string *)
                       internal::ArenaImpl::AllocateAlignedAndAddCleanup
                                 (&pAVar11->impl_,0x20,
                                  internal::arena_destruct_object<std::__cxx11::string>);
            }
            (psVar7->_M_dataplus)._M_p = (pointer)&psVar7->field_2;
            psVar7->_M_string_length = 0;
            (psVar7->field_2)._M_local_buf[0] = '\0';
            pRVar3 = (this->oneofs_).super_RepeatedPtrFieldBase.rep_;
            iVar10 = (this->oneofs_).super_RepeatedPtrFieldBase.current_size_;
            pRVar8 = (Rep *)(long)iVar10;
            (this->oneofs_).super_RepeatedPtrFieldBase.current_size_ = iVar10 + 1;
            pRVar3->elements[(long)pRVar8] = psVar7;
          }
          else {
            iVar2 = (this->oneofs_).super_RepeatedPtrFieldBase.current_size_;
            iVar10 = pRVar8->allocated_size;
            if (iVar10 <= iVar2) {
              if (iVar10 == (this->oneofs_).super_RepeatedPtrFieldBase.total_size_)
              goto LAB_0020c9bb;
              goto LAB_0020c9cb;
            }
            (this->oneofs_).super_RepeatedPtrFieldBase.current_size_ = iVar2 + 1;
            psVar7 = (string *)pRVar8->elements[iVar2];
          }
          local_38 = (byte *)internal::InlineGreedyStringParser(psVar7,(char *)local_38,ctx);
          piVar4 = (internal *)(psVar7->_M_dataplus)._M_p;
          pcVar5 = (char *)psVar7->_M_string_length;
          if ((long)pcVar5 < 0) {
            StringPiece::LogFatalSizeTooBig((size_t)pcVar5,"size_t to int conversion");
          }
          str_00.length_ = (stringpiece_ssize_type)"google.protobuf.Type.oneofs";
          str_00.ptr_ = pcVar5;
          bVar6 = internal::VerifyUTF8(piVar4,str_00,(char *)pRVar8);
          if (!bVar6) {
            return (char *)0x0;
          }
          if (local_38 == (byte *)0x0) {
            return (char *)0x0;
          }
        } while ((local_38 < (ctx->super_EpsCopyInputStream).limit_end_) && (*local_38 == 0x1a));
        goto LAB_0020cc3e;
      }
      break;
    case 4:
      if (cVar12 == '\"') {
        local_38 = p + -1;
        do {
          local_38 = local_38 + 1;
          pRVar8 = (this->options_).super_RepeatedPtrFieldBase.rep_;
          if (pRVar8 == (Rep *)0x0) {
            iVar10 = (this->options_).super_RepeatedPtrFieldBase.total_size_;
LAB_0020cad4:
            internal::RepeatedPtrFieldBase::Reserve
                      (&(this->options_).super_RepeatedPtrFieldBase,iVar10 + 1);
            pRVar8 = (this->options_).super_RepeatedPtrFieldBase.rep_;
            iVar10 = pRVar8->allocated_size;
LAB_0020cae5:
            pRVar8->allocated_size = iVar10 + 1;
            msg_00 = Arena::CreateMaybeMessage<google::protobuf::Option>
                               ((this->options_).super_RepeatedPtrFieldBase.arena_);
            pRVar8 = (this->options_).super_RepeatedPtrFieldBase.rep_;
            iVar10 = (this->options_).super_RepeatedPtrFieldBase.current_size_;
            (this->options_).super_RepeatedPtrFieldBase.current_size_ = iVar10 + 1;
            pRVar8->elements[iVar10] = msg_00;
          }
          else {
            iVar2 = (this->options_).super_RepeatedPtrFieldBase.current_size_;
            iVar10 = pRVar8->allocated_size;
            if (iVar10 <= iVar2) {
              if (iVar10 == (this->options_).super_RepeatedPtrFieldBase.total_size_)
              goto LAB_0020cad4;
              goto LAB_0020cae5;
            }
            (this->options_).super_RepeatedPtrFieldBase.current_size_ = iVar2 + 1;
            msg_00 = (Option *)pRVar8->elements[iVar2];
          }
          local_38 = (byte *)internal::ParseContext::ParseMessage<google::protobuf::Option>
                                       (ctx,msg_00,(char *)local_38);
          if (local_38 == (byte *)0x0) {
            return (char *)0x0;
          }
        } while ((local_38 < (ctx->super_EpsCopyInputStream).limit_end_) && (*local_38 == 0x22));
        goto LAB_0020cc3e;
      }
      break;
    case 5:
      if (cVar12 != '*') break;
      msg = this->source_context_;
      if (msg == (SourceContext *)0x0) {
        pAVar11 = (Arena *)this_00->ptr_;
        if (((ulong)pAVar11 & 1) != 0) {
          pAVar11 = *(Arena **)((ulong)pAVar11 & 0xfffffffffffffffe);
        }
        msg = Arena::CreateMaybeMessage<google::protobuf::SourceContext>(pAVar11);
        this->source_context_ = msg;
      }
      local_38 = (byte *)internal::ParseContext::ParseMessage<google::protobuf::SourceContext>
                                   (ctx,msg,(char *)local_38);
      goto LAB_0020cc7e;
    case 6:
      if (cVar12 == '0') {
        uVar9 = (ulong)(char)*p;
        local_38 = p + 1;
        if ((long)uVar9 < 0) {
          uVar13 = ((uint)*local_38 * 0x80 + (uint)*p) - 0x80;
          if (-1 < (char)*local_38) {
            uVar9 = (ulong)uVar13;
            local_38 = p + 2;
            goto LAB_0020cc36;
          }
          local_38 = p;
          pVar15 = internal::VarintParseSlow64((char *)p,uVar13);
          iVar10 = (int)pVar15.second;
          local_38 = (byte *)pVar15.first;
          if (local_38 == (byte *)0x0) {
            return (char *)0x0;
          }
        }
        else {
LAB_0020cc36:
          iVar10 = (int)uVar9;
        }
        this->syntax_ = iVar10;
        goto LAB_0020cc3e;
      }
    }
    if ((uVar13 == 0) || ((uVar13 & 7) == 4)) {
      (ctx->super_EpsCopyInputStream).last_tag_minus_1_ = uVar13 - 1;
      return (char *)p;
    }
    if (((ulong)this_00->ptr_ & 1) == 0) {
      unknown = internal::InternalMetadata::
                mutable_unknown_fields_slow<google::protobuf::UnknownFieldSet>(this_00);
    }
    else {
      unknown = (UnknownFieldSet *)(((ulong)this_00->ptr_ & 0xfffffffffffffffe) + 8);
    }
    local_38 = (byte *)internal::UnknownFieldParse((ulong)uVar13,unknown,(char *)local_38,ctx);
LAB_0020cc7e:
    cVar12 = '\x02';
    if (local_38 == (byte *)0x0) {
      return (char *)0x0;
    }
LAB_0020cc8a:
    if (cVar12 != '\x02') {
      return (char *)0x0;
    }
  } while( true );
}

Assistant:

const char* Type::_InternalParse(const char* ptr, ::PROTOBUF_NAMESPACE_ID::internal::ParseContext* ctx) {
#define CHK_(x) if (PROTOBUF_PREDICT_FALSE(!(x))) goto failure
  ::PROTOBUF_NAMESPACE_ID::Arena* arena = GetArena(); (void)arena;
  while (!ctx->Done(&ptr)) {
    ::PROTOBUF_NAMESPACE_ID::uint32 tag;
    ptr = ::PROTOBUF_NAMESPACE_ID::internal::ReadTag(ptr, &tag);
    CHK_(ptr);
    switch (tag >> 3) {
      // string name = 1;
      case 1:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 10)) {
          auto str = _internal_mutable_name();
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParser(str, ptr, ctx);
          CHK_(::PROTOBUF_NAMESPACE_ID::internal::VerifyUTF8(str, "google.protobuf.Type.name"));
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // repeated .google.protobuf.Field fields = 2;
      case 2:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 18)) {
          ptr -= 1;
          do {
            ptr += 1;
            ptr = ctx->ParseMessage(_internal_add_fields(), ptr);
            CHK_(ptr);
            if (!ctx->DataAvailable(ptr)) break;
          } while (::PROTOBUF_NAMESPACE_ID::internal::ExpectTag<18>(ptr));
        } else goto handle_unusual;
        continue;
      // repeated string oneofs = 3;
      case 3:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 26)) {
          ptr -= 1;
          do {
            ptr += 1;
            auto str = _internal_add_oneofs();
            ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParser(str, ptr, ctx);
            CHK_(::PROTOBUF_NAMESPACE_ID::internal::VerifyUTF8(str, "google.protobuf.Type.oneofs"));
            CHK_(ptr);
            if (!ctx->DataAvailable(ptr)) break;
          } while (::PROTOBUF_NAMESPACE_ID::internal::ExpectTag<26>(ptr));
        } else goto handle_unusual;
        continue;
      // repeated .google.protobuf.Option options = 4;
      case 4:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 34)) {
          ptr -= 1;
          do {
            ptr += 1;
            ptr = ctx->ParseMessage(_internal_add_options(), ptr);
            CHK_(ptr);
            if (!ctx->DataAvailable(ptr)) break;
          } while (::PROTOBUF_NAMESPACE_ID::internal::ExpectTag<34>(ptr));
        } else goto handle_unusual;
        continue;
      // .google.protobuf.SourceContext source_context = 5;
      case 5:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 42)) {
          ptr = ctx->ParseMessage(_internal_mutable_source_context(), ptr);
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // .google.protobuf.Syntax syntax = 6;
      case 6:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 48)) {
          ::PROTOBUF_NAMESPACE_ID::uint64 val = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint64(&ptr);
          CHK_(ptr);
          _internal_set_syntax(static_cast<PROTOBUF_NAMESPACE_ID::Syntax>(val));
        } else goto handle_unusual;
        continue;
      default: {
      handle_unusual:
        if ((tag & 7) == 4 || tag == 0) {
          ctx->SetLastTag(tag);
          goto success;
        }
        ptr = UnknownFieldParse(tag,
            _internal_metadata_.mutable_unknown_fields<::PROTOBUF_NAMESPACE_ID::UnknownFieldSet>(),
            ptr, ctx);
        CHK_(ptr != nullptr);
        continue;
      }
    }  // switch
  }  // while
success:
  return ptr;
failure:
  ptr = nullptr;
  goto success;
#undef CHK_
}